

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_dir.cpp
# Opt level: O2

bool IsCpmDirSector(Sector *sector)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  Data *pDVar4;
  
  iVar3 = Sector::data_size(sector);
  if (iVar3 < 0x200) {
    bVar2 = false;
  }
  else {
    pDVar4 = Sector::data_copy(sector,0);
    uVar1 = (sector->header).sector;
    if ((uVar1 == 1) &&
       (bVar2 = IsCpmDpb((pDVar4->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start), bVar2)) {
      return true;
    }
    bVar2 = SUB41((uVar1 & 0x40) >> 6,0);
  }
  return bVar2;
}

Assistant:

bool IsCpmDirSector(const Sector& sector)
{
    if (sector.data_size() < SECTOR_SIZE)
        return false;

    auto pb = sector.data_copy().data();

    if (sector.header.sector == 1 && IsCpmDpb(pb))
        return true;
    else if ((sector.header.sector & 0x40) == 0x40)
        return true;    // uReserved = 2, nDirBlocks = 4;
    else if ((sector.header.sector & 0xc0) != 0xc0)
        return false;

    // Check all the directory entries in the sector
    for (auto u = 0; u < SECTOR_SIZE; u += sizeof(CPM_DIR))
    {
        if (!IsCpmDirEntry(pb + u))
            return false;
    }

    return true;
}